

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O0

void __thiscall
soplex::SPxWeightST<double>::generate(SPxWeightST<double> *this,SPxSolverBase<double> *base)

{
  double dVar1;
  bool bVar2;
  Representation RVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  DataKey *pDVar9;
  SVectorBase<double> *this_00;
  char *pcVar10;
  double *pdVar11;
  element_type *peVar12;
  SPxId desc_00;
  int __c;
  int __c_00;
  int __c_01;
  SPxSolverBase<double> *in_RSI;
  long *in_RDI;
  Real RVar13;
  double feastol;
  int k_1;
  double x_1;
  int nRowEntries;
  int k;
  double x;
  int minRowEntries;
  int idx;
  SVectorBase<double> *vec;
  double maxEntry;
  int dim;
  int sel;
  int j;
  int stepi;
  int i;
  DataArray<soplex::SPxId> pref;
  Desc desc;
  SPxId tmpId;
  int in_stack_fffffffffffffe1c;
  SPxSolverBase<double> *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  DataArray<soplex::SPxId> *in_stack_fffffffffffffe30;
  DataKey in_stack_fffffffffffffe38;
  SPxSolverBase<double> *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe54;
  SPxSolverBase<double> *in_stack_fffffffffffffe58;
  SPxSolverBase<double> *base_00;
  Desc *in_stack_fffffffffffffe60;
  SPxSolverBase<double> *in_stack_fffffffffffffe98;
  SPxSolverBase<double> *in_stack_fffffffffffffea0;
  Desc *in_stack_fffffffffffffea8;
  SPxWeightST<double> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Array<double> *in_stack_ffffffffffffff60;
  SPxSolverBase<double> *in_stack_ffffffffffffff68;
  double dVar14;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint local_88;
  int local_84;
  int local_80;
  DataArray<soplex::SPxId> local_70;
  undefined1 local_58 [64];
  DataKey local_18;
  SPxSolverBase<double> *local_10;
  
  local_10 = in_RSI;
  SPxId::SPxId((SPxId *)0x2a1084);
  SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2a10a5);
  DataArray<int>::reSize((DataArray<int> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2a10d5);
  Array<double>::reSize((Array<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2a1105);
  Array<double>::reSize((Array<double> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2a1135);
  DataArray<bool>::reSize((DataArray<bool> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2a1167);
  DataArray<bool>::reSize((DataArray<bool> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
  RVar3 = SPxSolverBase<double>::rep(local_10);
  if (RVar3 == COLUMN) {
    in_RDI[7] = (long)(in_RDI + 0xc);
    in_RDI[8] = (long)(in_RDI + 9);
  }
  else {
    in_RDI[7] = (long)(in_RDI + 9);
    in_RDI[8] = (long)(in_RDI + 0xc);
  }
  (**(code **)(*in_RDI + 0x40))(in_RDI,local_10);
  SPxBasisBase<double>::Desc::Desc(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2a1201);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2a1217);
  DataArray<soplex::SPxId>::DataArray
            (in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
             (int)in_stack_fffffffffffffe28,(Real)in_stack_fffffffffffffe20);
  initPrefs<double>((DataArray<soplex::SPxId> *)
                    CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                    (Array<double> *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  for (local_80 = 0; iVar4 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2a1299),
      local_80 < iVar4; local_80 = local_80 + 1) {
    piVar8 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),local_80);
    *piVar8 = 0;
  }
  RVar3 = SPxSolverBase<double>::rep(local_10);
  if (RVar3 == COLUMN) {
    local_80 = 0;
    local_84 = 1;
  }
  else {
    local_80 = DataArray<soplex::SPxId>::size(&local_70);
    local_80 = local_80 + -1;
    local_84 = -1;
  }
  iVar4 = SPxSolverBase<double>::dim((SPxSolverBase<double> *)0x2a138d);
  dVar14 = 0.0;
  do {
    bVar2 = false;
    if (-1 < local_80) {
      iVar5 = DataArray<soplex::SPxId>::size(&local_70);
      bVar2 = local_80 < iVar5;
    }
    if (!bVar2) goto LAB_002a1c38;
    pDVar9 = &DataArray<soplex::SPxId>::operator[](&local_70,local_80)->super_DataKey;
    local_18 = *pDVar9;
    this_00 = SPxSolverBase<double>::vector
                        (in_stack_fffffffffffffe40,(SPxId *)in_stack_fffffffffffffe38);
    iVar5 = -1;
    iVar6 = SVectorBase<double>::size(this_00);
    if (iVar6 == 1) {
      pcVar10 = SVectorBase<double>::index(this_00,(char *)0x0,__c);
      iVar6 = (int)pcVar10;
      piVar8 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),iVar6);
      if (*piVar8 < 2) {
        piVar8 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),iVar6);
        iVar4 = (uint)(0 < *piVar8) + iVar4;
        iVar5 = iVar6;
      }
    }
    else {
      dVar14 = SVectorBase<double>::maxAbs((SVectorBase<double> *)in_stack_fffffffffffffe30);
      iVar6 = SPxLPBase<double>::nRows((SPxLPBase<double> *)0x2a151a);
      local_88 = SVectorBase<double>::size(this_00);
      while (local_88 = local_88 - 1, -1 < (int)local_88) {
        pdVar11 = SVectorBase<double>::value(this_00,local_88);
        RVar13 = *pdVar11;
        pcVar10 = SVectorBase<double>::index(this_00,(char *)(ulong)local_88,__c_00);
        in_stack_fffffffffffffeb0 =
             (SPxWeightST<double> *)
             SPxSolverBase<double>::coVector(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
        iVar7 = SVectorBase<double>::size((SVectorBase<double> *)in_stack_fffffffffffffeb0);
        piVar8 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),(int)pcVar10);
        if (*piVar8 == 0) {
          in_stack_fffffffffffffea0 = (SPxSolverBase<double> *)spxAbs<double>(RVar13);
          in_stack_fffffffffffffea8 = (Desc *)(**(code **)(*in_RDI + 0x30))();
          peVar12 = std::
                    __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2a162d);
          RVar13 = Tolerances::scaleAccordingToEpsilon(peVar12,0.001);
          if ((RVar13 * dVar14 < (double)in_stack_fffffffffffffea0) && (iVar7 < iVar6)) {
            iVar6 = iVar7;
            iVar5 = (int)pcVar10;
          }
        }
      }
    }
    if (iVar5 < 0) {
      RVar3 = SPxSolverBase<double>::rep(local_10);
      if (RVar3 == COLUMN) {
        DataArray<soplex::SPxId>::operator[](&local_70,local_80);
        setPrimalStatus(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                        in_stack_fffffffffffffea0,(SPxId *)in_stack_fffffffffffffe98);
      }
      else {
        in_stack_fffffffffffffe20 = local_10;
        DataArray<soplex::SPxId>::operator[](&local_70,local_80);
        setDualStatus<double>
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   (SPxId *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      }
    }
    else {
      piVar8 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),iVar5);
      *piVar8 = 2;
      RVar3 = SPxSolverBase<double>::rep(local_10);
      if (RVar3 == COLUMN) {
        in_stack_fffffffffffffe98 = local_10;
        DataArray<soplex::SPxId>::operator[](&local_70,local_80);
        setDualStatus<double>
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                   (SPxId *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      }
      else {
        DataArray<soplex::SPxId>::operator[](&local_70,local_80);
        setPrimalStatus(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                        in_stack_fffffffffffffea0,(SPxId *)in_stack_fffffffffffffe98);
      }
      local_88 = SVectorBase<double>::size(this_00);
      while (local_88 = local_88 - 1, -1 < (int)local_88) {
        pdVar11 = SVectorBase<double>::value(this_00,local_88);
        dVar1 = *pdVar11;
        pcVar10 = SVectorBase<double>::index(this_00,(char *)(ulong)local_88,__c_01);
        (**(code **)(*in_RDI + 0x30))();
        peVar12 = std::
                  __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x2a17d7);
        RVar13 = Tolerances::floatingPointFeastol(peVar12);
        piVar8 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),(int)pcVar10);
        if ((*piVar8 == 0) && ((RVar13 * dVar14 < dVar1 || (RVar13 * dVar14 < -dVar1)))) {
          piVar8 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),(int)pcVar10);
          *piVar8 = 1;
          iVar4 = iVar4 + -1;
        }
      }
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        RVar3 = SPxSolverBase<double>::rep(local_10);
        if (RVar3 == COLUMN) {
          while( true ) {
            local_80 = local_84 + local_80;
            bVar2 = false;
            if (-1 < local_80) {
              iVar4 = DataArray<soplex::SPxId>::size(&local_70);
              bVar2 = local_80 < iVar4;
            }
            if (!bVar2) break;
            DataArray<soplex::SPxId>::operator[](&local_70,local_80);
            setPrimalStatus(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                            in_stack_fffffffffffffea0,(SPxId *)in_stack_fffffffffffffe98);
          }
          local_80 = DataArray<int>::size((DataArray<int> *)(in_RDI + 4));
          while (local_80 = local_80 + -1, -1 < local_80) {
            piVar8 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),local_80);
            if (*piVar8 < 2) {
              base_00 = local_10;
              desc_00 = SPxSolverBase<double>::coId
                                  (in_stack_fffffffffffffe38,
                                   (int)((ulong)in_stack_fffffffffffffe30 >> 0x20));
              setDualStatus<double>
                        ((Desc *)desc_00.super_DataKey,base_00,
                         (SPxId *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
            }
          }
        }
        else {
          while( true ) {
            local_80 = local_84 + local_80;
            in_stack_fffffffffffffe54 = in_stack_fffffffffffffe54 & 0xffffff;
            if (-1 < local_80) {
              in_stack_fffffffffffffe50 = DataArray<soplex::SPxId>::size(&local_70);
              in_stack_fffffffffffffe54 =
                   CONCAT13(local_80 < in_stack_fffffffffffffe50,(int3)in_stack_fffffffffffffe54);
            }
            if ((char)(in_stack_fffffffffffffe54 >> 0x18) == '\0') break;
            DataArray<soplex::SPxId>::operator[](&local_70,local_80);
            setDualStatus<double>
                      (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                       (SPxId *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
          }
          local_80 = DataArray<int>::size((DataArray<int> *)(in_RDI + 4));
          while (local_80 = local_80 + -1, -1 < local_80) {
            piVar8 = DataArray<int>::operator[]((DataArray<int> *)(in_RDI + 4),local_80);
            if (*piVar8 < 2) {
              in_stack_fffffffffffffe38 =
                   (DataKey)SPxSolverBase<double>::coId
                                      ((SPxSolverBase<double> *)in_stack_fffffffffffffe38,
                                       (int)((ulong)local_10 >> 0x20));
              setPrimalStatus(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                              in_stack_fffffffffffffea0,(SPxId *)in_stack_fffffffffffffe98);
            }
          }
        }
LAB_002a1c38:
        (*(local_10->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x58])(local_10,local_58);
        DataArray<soplex::SPxId>::~DataArray((DataArray<soplex::SPxId> *)in_stack_fffffffffffffe20);
        SPxBasisBase<double>::Desc::~Desc((Desc *)in_stack_fffffffffffffe20);
        return;
      }
    }
    local_80 = local_84 + local_80;
  } while( true );
}

Assistant:

void SPxWeightST<R>::generate(SPxSolverBase<R>& base)
{
   SPxId tmpId;

   forbidden.reSize(base.dim());
   rowWeight.reSize(base.nRows());
   colWeight.reSize(base.nCols());
   rowRight.reSize(base.nRows());
   colUp.reSize(base.nCols());

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      weight   = &colWeight;
      coWeight = &rowWeight;
   }
   else
   {
      weight   = &rowWeight;
      coWeight = &colWeight;
   }

   assert(weight->size()   == base.coDim());
   assert(coWeight->size() == base.dim());

   setupWeights(base);

   typename SPxBasisBase<R>::Desc desc(base);
   //   desc.reSize(base.nRows(), base.nCols());

   DataArray < SPxId > pref(base.nRows() + base.nCols());
   initPrefs(pref, base, rowWeight, colWeight);

   int i;
   int stepi;
   int j;
   int sel;

   for(i = 0; i < base.dim(); ++i)
      forbidden[i] = 0;

   if(base.rep() == SPxSolverBase<R>::COLUMN)
   {
      // in COLUMN rep we scan from beginning to end
      i      = 0;
      stepi = 1;
   }
   else
   {
      // in ROW rep we scan from end to beginning
      i      = pref.size() - 1;
      stepi = -1;
   }

   int  dim = base.dim();
   R maxEntry = 0;

   for(; i >= 0 && i < pref.size(); i += stepi)
   {
      tmpId              = pref[i];
      const SVectorBase<R>& vec = base.vector(tmpId);
      sel                = -1;

      // column or row singleton ?
      if(vec.size() == 1)
      {
         int idx = vec.index(0);

         if(forbidden[idx] < 2)
         {
            sel  = idx;
            dim += (forbidden[idx] > 0) ? 1 : 0;
         }
      }
      else
      {
         maxEntry = vec.maxAbs();

         // initialize the nonzero counter
         int minRowEntries = base.nRows();

         // find a stable index with a sparse row/column
         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            int  nRowEntries = base.coVector(k).size();

            if(!forbidden[k]
                  && (spxAbs(x) > this->tolerances()->scaleAccordingToEpsilon(SOPLEX_STABLE) * maxEntry)
                  && (nRowEntries < minRowEntries))
            {
               minRowEntries = nRowEntries;
               sel  = k;
            }
         }
      }

      // we found a valid index
      if(sel >= 0)
      {
         SPX_DEBUG(

            if(pref[i].type() == SPxId::ROW_ID)
            std::cout << "DWEIST01 r" << base.number(pref[i]);
            else
               std::cout << "DWEIST02 c" << base.number(pref[i]);
            )

               forbidden[sel] = 2;

         // put current column/row into basis
         if(base.rep() == SPxSolverBase<R>::COLUMN)
            setDualStatus(desc, base, pref[i]);
         else
            setPrimalStatus(desc, base, pref[i]);

         for(j = vec.size(); --j >= 0;)
         {
            R x = vec.value(j);
            int  k = vec.index(j);
            R feastol = this->tolerances()->floatingPointFeastol();

            if(!forbidden[k] && (x > feastol * maxEntry || -x > feastol * maxEntry))
            {
               forbidden[k] = 1;
               --dim;
            }
         }

         if(--dim == 0)
         {
            //@ for(++i; i < pref.size(); ++i)
            if(base.rep() == SPxSolverBase<R>::COLUMN)
            {
               // set all remaining indeces to nonbasic status
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setPrimalStatus(desc, base, pref[i]);

               // fill up the basis wherever linear independence is assured
               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setDualStatus(desc, base, base.coId(i));
               }
            }
            else
            {
               for(i += stepi; i >= 0 && i < pref.size(); i += stepi)
                  setDualStatus(desc, base, pref[i]);

               for(i = forbidden.size(); --i >= 0;)
               {
                  if(forbidden[i] < 2)
                     setPrimalStatus(desc, base, base.coId(i));
               }
            }

            break;
         }
      }
      // sel == -1
      else if(base.rep() == SPxSolverBase<R>::COLUMN)
         setPrimalStatus(desc, base, pref[i]);
      else
         setDualStatus(desc, base, pref[i]);

#ifndef NDEBUG
      {
         int n, m;

         for(n = 0, m = forbidden.size(); n < forbidden.size(); ++n)
            m -= (forbidden[n] != 0) ? 1 : 0;

         assert(m == dim);
      }
#endif  // NDEBUG
   }

   assert(dim == 0);

   base.loadBasis(desc);
#ifdef  TEST
   base.init();

   int changed = 0;
   const VectorBase<R>& pvec = base.pVec();

   for(i = pvec.dim() - 1; i >= 0; --i)
   {
      if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_UPPER
            && base.lower(i) > R(-infinity) && pvec[i] > base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else if(desc.colStatus(i) == SPxBasisBase<R>::Desc::P_ON_LOWER
              && base.upper(i) < R(infinity) && pvec[i] < base.maxObj(i))
      {
         changed = 1;
         desc.colStatus(i) = SPxBasisBase<R>::Desc::P_ON_UPPER;
      }
   }

   if(changed)
   {
      std::cout << "changed basis\n";
      base.loadBasis(desc);
   }
   else
      std::cout << "nothing changed\n";

#endif  // TEST
}